

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ResolvedConfig * __thiscall
slang::BumpAllocator::emplace<slang::ast::ResolvedConfig,slang::ast::ResolvedConfig_const&>
          (BumpAllocator *this,ResolvedConfig *args)

{
  ConfigBlockSymbol *pCVar1;
  InstanceSymbol *pIVar2;
  size_t sVar3;
  ResolvedConfig *pRVar4;
  
  pRVar4 = (ResolvedConfig *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ResolvedConfig *)this->endPtr < pRVar4 + 1) {
    pRVar4 = (ResolvedConfig *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pRVar4 + 1);
  }
  pRVar4->configRule = args->configRule;
  pCVar1 = args->useConfig;
  pIVar2 = args->rootInstance;
  sVar3 = (args->liblist)._M_extent._M_extent_value;
  (pRVar4->liblist)._M_ptr = (args->liblist)._M_ptr;
  (pRVar4->liblist)._M_extent._M_extent_value = sVar3;
  pRVar4->useConfig = pCVar1;
  pRVar4->rootInstance = pIVar2;
  return pRVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }